

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckAttrPropsCorrect(xmlSchemaParserCtxtPtr pctxt,xmlSchemaAttributePtr_conflict attr)

{
  xmlSchemaTypePtr *ppxVar1;
  int iVar2;
  xmlSchemaTypePtr type;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  xmlSchemaTypePtr pxVar3;
  xmlParserErrors error;
  xmlSchemaValPtr *retVal;
  char *message;
  
  type = attr->subtypes;
  if ((type != (xmlSchemaTypePtr)0x0) && (pxVar3 = type, attr->defValue != (xmlChar *)0x0)) {
    do {
      if ((pxVar3->type == XML_SCHEMA_TYPE_COMPLEX) || (iVar2 = pxVar3->builtInType, iVar2 == 0x2d))
      break;
      if (pxVar3->type == XML_SCHEMA_TYPE_BASIC) {
        if (iVar2 == 0x17) {
          message = 
          "Value constraints are not allowed if the type definition is or is derived from xs:ID";
          error = XML_SCHEMAP_A_PROPS_CORRECT_3;
          goto LAB_001c1e8c;
        }
        if (iVar2 == 0x2e) break;
      }
      ppxVar1 = &pxVar3->subtypes;
      pxVar3 = *ppxVar1;
    } while (*ppxVar1 != (xmlSchemaTypePtr)0x0);
    retVal = &attr->defVal;
    in_EAX = xmlSchemaVCheckCVCSimpleType
                       ((xmlSchemaAbstractCtxtPtr)pctxt,attr->node,type,attr->defValue,retVal,1,1,0)
    ;
    if (in_EAX != 0) {
      if (in_EAX < 0) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaCheckAttrPropsCorrect",
                   "calling xmlSchemaVCheckCVCSimpleType()",(xmlChar *)0x0,(xmlChar *)retVal);
        return extraout_EAX;
      }
      message = "The value of the value constraint is not valid";
      error = XML_SCHEMAP_A_PROPS_CORRECT_2;
LAB_001c1e8c:
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,error,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)attr,message,(xmlChar *)0x0,(xmlChar *)0x0,
                          (xmlChar *)0x0,(xmlChar *)0x0);
      in_EAX = extraout_EAX_00;
    }
  }
  return in_EAX;
}

Assistant:

static int
xmlSchemaCheckAttrPropsCorrect(xmlSchemaParserCtxtPtr pctxt,
			       xmlSchemaAttributePtr attr)
{

    /*
    * SPEC a-props-correct (1)
    * "The values of the properties of an attribute declaration must
    * be as described in the property tableau in The Attribute
    * Declaration Schema Component ($3.2.1), modulo the impact of
    * Missing Sub-components ($5.3)."
    */

    if (WXS_ATTR_TYPEDEF(attr) == NULL)
	return(0);

    if (attr->defValue != NULL) {
	int ret;

	/*
	* SPEC a-props-correct (3)
	* "If the {type definition} is or is derived from ID then there
	* must not be a {value constraint}."
	*/
	if (xmlSchemaIsDerivedFromBuiltInType(
	    WXS_ATTR_TYPEDEF(attr), XML_SCHEMAS_ID))
	{
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_A_PROPS_CORRECT_3,
		NULL, WXS_BASIC_CAST attr,
		"Value constraints are not allowed if the type definition "
		"is or is derived from xs:ID",
		NULL, NULL);
	    return(pctxt->err);
	}
	/*
	* SPEC a-props-correct (2)
	* "if there is a {value constraint}, the canonical lexical
	* representation of its value must be `valid` with respect
	* to the {type definition} as defined in String Valid ($3.14.4)."
	* TODO: Don't care about the *canonical* stuff here, this requirement
	* will be removed in WXS 1.1 anyway.
	*/
	ret = xmlSchemaVCheckCVCSimpleType(ACTXT_CAST pctxt,
	    attr->node, WXS_ATTR_TYPEDEF(attr),
	    attr->defValue, &(attr->defVal),
	    1, 1, 0);
	if (ret != 0) {
	    if (ret < 0) {
		PERROR_INT("xmlSchemaCheckAttrPropsCorrect",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		return(-1);
	    }
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_A_PROPS_CORRECT_2,
		NULL, WXS_BASIC_CAST attr,
		"The value of the value constraint is not valid",
		NULL, NULL);
	    return(pctxt->err);
	}
    }

    return(0);
}